

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListWGL.cpp
# Opt level: O2

void glcts::getConfigListWGL(Platform *param_1,ApiType param_2,ConfigList *param_3)

{
  Exception *this;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  this = (Exception *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,param_2.m_bits));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"WGL is not supported on this OS",&local_39);
  tcu::Exception::Exception(this,&local_38);
  __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void getConfigListWGL(tcu::Platform&, glu::ApiType, ConfigList&)
{
	throw tcu::Exception("WGL is not supported on this OS");
}